

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::AdvancedCopyImageFS::Setup(AdvancedCopyImageFS *this)

{
  GLuint GVar1;
  CallLogWrapper *this_00;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *glsl_cs;
  char *glsl_fs;
  char *glsl_vs;
  AdvancedCopyImageFS *this_local;
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glsl_vs = (char *)this;
  glu::CallLogWrapper::glGenTextures(this_00,2,this->m_texture);
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,&this->m_ebo);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
  glsl_fs = 
  "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}";
  glsl_cs = 
  "\nlayout(rgba32f, binding = 3) readonly uniform image2D g_input_image;\nlayout(rgba32f, binding = 1) writeonly uniform image2D g_output_image;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord);\n  imageStore(g_output_image, coord, imageLoad(g_input_image, coord));\n  discard;\n}"
  ;
  GVar1 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,
                     "\nlayout(rgba32f, binding = 3) readonly uniform image2D g_input_image;\nlayout(rgba32f, binding = 1) writeonly uniform image2D g_output_image;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord);\n  imageStore(g_output_image, coord, imageLoad(g_input_image, coord));\n  discard;\n}"
                     ,false,false);
  this->m_program = GVar1;
  local_28 = 
  "\n#define KSIZE 11\nlayout (local_size_x = KSIZE, local_size_y = KSIZE) in;\nlayout(rgba32f, binding = 2) readonly uniform image2D g_image;\nlayout(std430) buffer out_data {\n  vec4 data[KSIZE*KSIZE];\n};\nvoid main() {\n  ivec2 coord = ivec2(gl_LocalInvocationID);\n  data[gl_LocalInvocationIndex] = imageLoad(g_image, coord);\n}"
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "\n#define KSIZE 11\nlayout (local_size_x = KSIZE, local_size_y = KSIZE) in;\nlayout(rgba32f, binding = 2) readonly uniform image2D g_image;\nlayout(std430) buffer out_data {\n  vec4 data[KSIZE*KSIZE];\n};\nvoid main() {\n  ivec2 coord = ivec2(gl_LocalInvocationID);\n  data[gl_LocalInvocationIndex] = imageLoad(g_image, coord);\n}"
             ,&local_49);
  GVar1 = ShaderImageLoadStoreBase::CreateComputeProgram
                    (&this->super_ShaderImageLoadStoreBase,&local_48,false);
  this->c_program = GVar1;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return 0;
}

Assistant:

virtual long Setup()
	{
		glGenTextures(2, m_texture);
		CreateFullViewportQuad(&m_vao, &m_vbo, &m_ebo);
		glGenBuffers(1, &m_buffer);

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL "  gl_Position = i_position;" NL "}";
		const char* const glsl_fs =
			NL "layout(rgba32f, binding = 3) readonly uniform image2D g_input_image;" NL
			   "layout(rgba32f, binding = 1) writeonly uniform image2D g_output_image;" NL "void main() {" NL
			   "  ivec2 coord = ivec2(gl_FragCoord);" NL
			   "  imageStore(g_output_image, coord, imageLoad(g_input_image, coord));" NL "  discard;" NL "}";
		m_program				  = BuildProgram(glsl_vs, glsl_fs);
		const char* const glsl_cs = NL
			"#define KSIZE 11" NL "layout (local_size_x = KSIZE, local_size_y = KSIZE) in;" NL
			"layout(rgba32f, binding = 2) readonly uniform image2D g_image;" NL "layout(std430) buffer out_data {" NL
			"  vec4 data[KSIZE*KSIZE];" NL "};" NL "void main() {" NL "  ivec2 coord = ivec2(gl_LocalInvocationID);" NL
			"  data[gl_LocalInvocationIndex] = imageLoad(g_image, coord);" NL "}";
		c_program = CreateComputeProgram(glsl_cs);

		return NO_ERROR;
	}